

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_mesh_tasks(CompilerGLSL *this,SPIRBlock *block)

{
  string sStack_78;
  string local_58;
  string local_38;
  
  to_unpacked_expression_abi_cxx11_(&local_58,this,(block->mesh).groups[0].id,true);
  to_unpacked_expression_abi_cxx11_(&sStack_78,this,(block->mesh).groups[1].id,true);
  to_unpacked_expression_abi_cxx11_(&local_38,this,(block->mesh).groups[2].id,true);
  statement<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            (this,(char (*) [18])"EmitMeshTasksEXT(",&local_58,(char (*) [3])0x3b2a97,&sStack_78,
             (char (*) [3])0x3b2a97,&local_38,(char (*) [3])0x39d4ef);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void CompilerGLSL::emit_mesh_tasks(SPIRBlock &block)
{
	statement("EmitMeshTasksEXT(",
	          to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ",
	          to_unpacked_expression(block.mesh.groups[2]), ");");
}